

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isPossibleModportPort(TokenKind kind)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  
  uVar1 = CONCAT22(in_register_0000003a,kind) - 0xa5;
  if ((((0x1d < uVar1) || ((0x31000001U >> (uVar1 & 0x1f) & 1) == 0)) &&
      (CONCAT22(in_register_0000003a,kind) != 0x11)) &&
     (((CONCAT22(in_register_0000003a,kind) != 0x18 && (CONCAT22(in_register_0000003a,kind) != 0x7a)
       ) && ((CONCAT22(in_register_0000003a,kind) != 0xe7 &&
             (CONCAT22(in_register_0000003a,kind) != 0x100)))))) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPossibleModportPort(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis:
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
        case TokenKind::RefKeyword:
        case TokenKind::ClockingKeyword:
        case TokenKind::ImportKeyword:
        case TokenKind::ExportKeyword:
        case TokenKind::Comma:
            return true;
        default:
            return false;
    }
}